

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

void __thiscall
TasGrid::GridWavelet::GridWavelet
          (GridWavelet *this,AccelerationContext *acc,MultiIndexSet *pset,int cnum_outputs,
          int corder,Data2D<double> *vals)

{
  StorageSet local_88;
  MultiIndexSet local_58;
  
  local_58.num_dimensions = 0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.num_outputs = 0;
  local_88.num_values = 0;
  local_88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BaseCanonicalGrid::BaseCanonicalGrid
            (&this->super_BaseCanonicalGrid,acc,(int)pset->num_dimensions,cnum_outputs,pset,
             &local_58,&local_88);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_88.values.super__Vector_base<double,_std::allocator<double>_>);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_58.indexes.super__Vector_base<int,_std::allocator<int>_>);
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridWavelet_001ff470
  ;
  RuleWavelet::RuleWavelet(&this->rule1D,corder,10);
  this->order = corder;
  (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coefficients).stride = 0;
  (this->coefficients).num_strips = 0;
  (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inter_matrix).tol = 1e-12;
  (this->inter_matrix).num_rows = 0;
  memset(&(this->inter_matrix).pntr,0,0xe0);
  local_58.num_dimensions = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  if (0 < (long)local_58.num_dimensions) {
    local_58._8_8_ = SEXT48((this->super_BaseCanonicalGrid).points.cache_num_indexes);
    local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    (vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_88.num_outputs = 0;
    local_88.num_values = 0;
    local_88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    StorageSet::operator=(&(this->super_BaseCanonicalGrid).values,(StorageSet *)&local_58);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_58.indexes);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_88);
    recomputeCoefficients(this);
  }
  return;
}

Assistant:

GridWavelet::GridWavelet(AccelerationContext const *acc, MultiIndexSet &&pset, int cnum_outputs, int corder, Data2D<double> &&vals) :
    BaseCanonicalGrid(acc, static_cast<int>(pset.getNumDimensions()), cnum_outputs, std::forward<MultiIndexSet>(pset),
                      MultiIndexSet(), StorageSet()),
    rule1D(corder, 10),
    order(corder)
{
    if (num_outputs > 0){
        values = StorageSet(num_outputs, points.getNumIndexes(), vals.release());
        recomputeCoefficients();
    }
}